

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O2

Interval * tcu::operator-(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  bool bVar1;
  undefined1 uVar2;
  Interval *val_arg_;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ScopedRoundingMode point_ctx_;
  Interval local_70;
  double local_58;
  undefined8 uStack_50;
  Interval local_40;
  
  uVar2 = false;
  __return_storage_ptr__->m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_hi + 4) = 0xfff00000;
  local_70.m_hasNaN = false;
  local_70.m_lo = INFINITY;
  local_70.m_hi = -INFINITY;
  local_40.m_hasNaN = false;
  local_40.m_lo = INFINITY;
  local_40.m_hi = -INFINITY;
  dVar4 = x->m_lo;
  if (dVar4 < x->m_hi || dVar4 == x->m_hi) {
    dVar6 = y->m_lo;
    if (dVar6 < y->m_hi || dVar6 == y->m_hi) {
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar6 = dVar4 - dVar6;
      dVar3 = dVar6;
      if (NAN(dVar6)) {
        dVar3 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      dVar5 = y->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      local_58 = (double)(-(ulong)NAN(dVar6) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar6) & (ulong)dVar6);
      dVar4 = dVar4 - dVar5;
      bVar1 = NAN(dVar4);
      dVar5 = dVar4;
      if (bVar1) {
        dVar5 = -INFINITY;
      }
      uStack_50 = 0;
      if (bVar1) {
        dVar4 = INFINITY;
      }
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_70.m_hasNaN = NAN(dVar6) || bVar1;
      local_70.m_lo =
           (double)(-(ulong)(dVar3 <= dVar4) & (ulong)dVar3 |
                   ~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4);
      local_70.m_hi =
           (double)(-(ulong)(dVar5 <= local_58) & (ulong)local_58 |
                   ~-(ulong)(dVar5 <= local_58) & (ulong)dVar5);
    }
    else {
      local_70.m_hi = -INFINITY;
      local_70.m_lo = INFINITY;
      local_70.m_hasNaN = false;
    }
    if (y->m_hasNaN == true) {
      point_ctx_.m_oldMode._0_1_ = 1;
      Interval::operator|=(&local_70,(Interval *)&point_ctx_);
    }
    dVar4 = y->m_lo;
    if (dVar4 < y->m_hi || dVar4 == y->m_hi) {
      dVar6 = x->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar4 = dVar6 - dVar4;
      dVar3 = dVar4;
      if (NAN(dVar4)) {
        dVar3 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      dVar5 = y->m_hi;
      point_ctx_.m_oldMode = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      local_58 = (double)(-(ulong)NAN(dVar4) & 0xfff0000000000000 |
                         ~-(ulong)NAN(dVar4) & (ulong)dVar4);
      dVar6 = dVar6 - dVar5;
      bVar1 = NAN(dVar6);
      dVar5 = dVar6;
      if (bVar1) {
        dVar5 = -INFINITY;
      }
      uStack_50 = 0;
      if (bVar1) {
        dVar6 = INFINITY;
      }
      ScopedRoundingMode::~ScopedRoundingMode(&point_ctx_);
      local_40.m_hasNaN = NAN(dVar4) || bVar1;
      local_40.m_lo =
           (double)(-(ulong)(dVar3 <= dVar6) & (ulong)dVar3 |
                   ~-(ulong)(dVar3 <= dVar6) & (ulong)dVar6);
      local_40.m_hi =
           (double)(-(ulong)(dVar5 <= local_58) & (ulong)local_58 |
                   ~-(ulong)(dVar5 <= local_58) & (ulong)dVar5);
    }
    else {
      local_40.m_lo = INFINITY;
      local_40.m_hi = -INFINITY;
      local_40.m_hasNaN = false;
    }
    if (y->m_hasNaN == true) {
      point_ctx_.m_oldMode._0_1_ = 1;
      Interval::operator|=(&local_40,(Interval *)&point_ctx_);
    }
    uVar2 = 1;
    if (local_70.m_hasNaN == false) {
      uVar2 = local_40.m_hasNaN;
    }
    dVar6 = (double)(~-(ulong)(local_70.m_lo <= local_40.m_lo) & (ulong)local_40.m_lo |
                    (ulong)local_70.m_lo & -(ulong)(local_70.m_lo <= local_40.m_lo));
    dVar4 = (double)(~-(ulong)(local_40.m_hi <= local_70.m_hi) & (ulong)local_40.m_hi |
                    (ulong)local_70.m_hi & -(ulong)(local_40.m_hi <= local_70.m_hi));
  }
  else {
    dVar4 = -INFINITY;
    dVar6 = INFINITY;
  }
  __return_storage_ptr__->m_hasNaN = (bool)uVar2;
  __return_storage_ptr__->m_lo = dVar6;
  __return_storage_ptr__->m_hi = dVar4;
  if (x->m_hasNaN == true) {
    point_ctx_.m_oldMode._0_1_ = 1;
    Interval::operator|=(__return_storage_ptr__,(Interval *)&point_ctx_);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator- (const Interval& x, const Interval& y)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, xp, x, yp, y, val,
								 TCU_SET_INTERVAL(val, point, point = xp - yp));
	return ret;
}